

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O3

unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>,_true>
__thiscall duckdb::ZSTDStorage::DeserializeState(ZSTDStorage *this,Deserializer *deserializer)

{
  tuple<duckdb::SerializedStringSegmentState_*,_std::default_delete<duckdb::SerializedStringSegmentState>_>
  this_00;
  pointer pSVar1;
  __uniq_ptr_impl<duckdb::SerializedStringSegmentState,_std::default_delete<duckdb::SerializedStringSegmentState>_>
  local_20;
  
  this_00.
  super__Tuple_impl<0UL,_duckdb::SerializedStringSegmentState_*,_std::default_delete<duckdb::SerializedStringSegmentState>_>
  .super__Head_base<0UL,_duckdb::SerializedStringSegmentState_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::SerializedStringSegmentState_*,_std::default_delete<duckdb::SerializedStringSegmentState>_>
        )operator_new(0x20);
  SerializedStringSegmentState::SerializedStringSegmentState
            ((SerializedStringSegmentState *)
             this_00.
             super__Tuple_impl<0UL,_duckdb::SerializedStringSegmentState_*,_std::default_delete<duckdb::SerializedStringSegmentState>_>
             .super__Head_base<0UL,_duckdb::SerializedStringSegmentState_*,_false>._M_head_impl);
  local_20._M_t.
  super__Tuple_impl<0UL,_duckdb::SerializedStringSegmentState_*,_std::default_delete<duckdb::SerializedStringSegmentState>_>
  .super__Head_base<0UL,_duckdb::SerializedStringSegmentState_*,_false>._M_head_impl =
       (tuple<duckdb::SerializedStringSegmentState_*,_std::default_delete<duckdb::SerializedStringSegmentState>_>
        )(tuple<duckdb::SerializedStringSegmentState_*,_std::default_delete<duckdb::SerializedStringSegmentState>_>
          )this_00.
           super__Tuple_impl<0UL,_duckdb::SerializedStringSegmentState_*,_std::default_delete<duckdb::SerializedStringSegmentState>_>
           .super__Head_base<0UL,_duckdb::SerializedStringSegmentState_*,_false>._M_head_impl;
  pSVar1 = unique_ptr<duckdb::SerializedStringSegmentState,_std::default_delete<duckdb::SerializedStringSegmentState>,_true>
           ::operator->((unique_ptr<duckdb::SerializedStringSegmentState,_std::default_delete<duckdb::SerializedStringSegmentState>,_true>
                         *)&local_20);
  Deserializer::ReadProperty<duckdb::vector<long,true>>
            (deserializer,1,"overflow_blocks",&(pSVar1->super_ColumnSegmentState).blocks);
  *(tuple<duckdb::SerializedStringSegmentState_*,_std::default_delete<duckdb::SerializedStringSegmentState>_>
    *)this = local_20._M_t.
             super__Tuple_impl<0UL,_duckdb::SerializedStringSegmentState_*,_std::default_delete<duckdb::SerializedStringSegmentState>_>
             .super__Head_base<0UL,_duckdb::SerializedStringSegmentState_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>)
         (unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>)
         this;
}

Assistant:

unique_ptr<ColumnSegmentState> ZSTDStorage::DeserializeState(Deserializer &deserializer) {
	auto result = make_uniq<SerializedStringSegmentState>();
	deserializer.ReadProperty(1, "overflow_blocks", result->blocks);
	return std::move(result);
}